

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# di.h
# Opt level: O2

void __thiscall di::Context::addInstance<B>(Context *this,B *instance,bool takeOwnership)

{
  mapped_type *pmVar1;
  runtime_error *prVar2;
  allocator local_59;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if (instance == (B *)0x0) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string
              ((string *)&local_38,"Trying to add nullptr instance for type: ",&local_59);
    std::operator+(&local_58,&local_38,"1B");
    std::runtime_error::runtime_error(prVar2,(string *)&local_58);
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_58._M_dataplus._M_p = (pointer)&B::typeinfo;
  pmVar1 = std::
           map<std::type_index,_di::Context::CtxItem,_std::less<std::type_index>,_std::allocator<std::pair<const_std::type_index,_di::Context::CtxItem>_>_>
           ::operator[](&this->items,(key_type *)&local_58);
  if (pmVar1->instancePtr == (void *)0x0) {
    pmVar1->instancePtr = instance;
    if (takeOwnership) {
      pmVar1->deleter = addInstance<B>::anon_class_1_0_00000001::__invoke;
      local_58._M_dataplus._M_p = (pointer)pmVar1;
      std::vector<di::Context::CtxItem*,std::allocator<di::Context::CtxItem*>>::
      emplace_back<di::Context::CtxItem*>
                ((vector<di::Context::CtxItem*,std::allocator<di::Context::CtxItem*>> *)
                 &this->constructionOrder,(CtxItem **)&local_58);
    }
    return;
  }
  prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string
            ((string *)&local_38,"Instance already in Context for type: ",&local_59);
  std::operator+(&local_58,&local_38,"1B");
  std::runtime_error::runtime_error(prVar2,(string *)&local_58);
  __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void addInstance(T* instance, bool takeOwnership = false)
    {
        if (instance == nullptr)
            throw std::runtime_error(std::string("Trying to add nullptr instance for type: ") + typeid(T).name());

        CtxItem& item = items[ std::type_index(typeid(T)) ];

        if (item.instancePtr != nullptr)
            throw std::runtime_error(std::string("Instance already in Context for type: ") + typeid(T).name());

        item.instancePtr = static_cast<void*>(instance);

        if (takeOwnership)
        {
            item.deleter = [](void* ptr) { delete( static_cast<T*>(ptr) ); };
            constructionOrder.push_back(&item);
        }
    }